

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer-test.cc
# Opt level: O0

void __thiscall
Buffer_init_unmanaged_Test::~Buffer_init_unmanaged_Test(Buffer_init_unmanaged_Test *this)

{
  Buffer_init_unmanaged_Test *this_local;
  
  ~Buffer_init_unmanaged_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Buffer, init_unmanaged) {
    // create a buffer with a stack-managed chunk of memory to use
    auto array = std::array<char, 32>{};
    auto buf = bfy_buffer_init_unmanaged(std::data(array), std::size(array));
    EXPECT_EQ(0, bfy_buffer_get_content_len(&buf));
    EXPECT_EQ(std::size(array), bfy_buffer_get_space_len(&buf));

    // Write something to the buffer and peek it.
    // That written data should be readable and located in `array`.
    auto constexpr str = std::string_view("Hello There!");
    EXPECT_EQ(0, bfy_buffer_add(&buf, std::data(str), std::size(str)));
    auto constexpr n_expected_vecs = 1;
    auto vecs = std::array<bfy_iovec, n_expected_vecs>{};
    EXPECT_EQ(n_expected_vecs, bfy_buffer_peek_all(&buf, std::data(vecs), std::size(vecs)));
    auto const expected_vecs = std::array<bfy_iovec, n_expected_vecs>{ {{ std::data(array), std::size(str) }} };
    EXPECT_EQ(expected_vecs, vecs);
    EXPECT_EQ(std::size(array) - std::size(str), bfy_buffer_get_space_len(&buf));

    bfy_buffer_destruct(&buf);
}